

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

void act_new(char *format,CHAR_DATA *ch,void *arg1,void *arg2,int type,int min_pos)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  CHAR_DATA *ch_00;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  char cVar8;
  char cVar9;
  char *pcVar10;
  char *pcVar11;
  ROOM_INDEX_DATA *pRVar12;
  CHAR_DATA **ppCVar13;
  CHAR_DATA *ch_01;
  int iVar14;
  char *pcVar15;
  ulong uVar16;
  string_view fmt;
  string_view fmt_00;
  size_t sStack_24f0;
  char *format_local;
  ulong local_24b8;
  CLogger *local_24b0;
  char buf2 [100];
  char buf [4608];
  char fname [4608];
  
  if (format == (char *)0x0) {
    return;
  }
  if (ch == (CHAR_DATA *)0x0) {
    return;
  }
  if (*format == '\0') {
    return;
  }
  pRVar12 = ch->in_room;
  if (pRVar12 == (ROOM_INDEX_DATA *)0x0) {
    return;
  }
  uVar16 = (ulong)(uint)type;
  format_local = format;
  if (type == 2) {
    if (arg2 == (void *)0x0) {
      fmt_00._M_str = "Act: null vch with TO_VICT. -- {}";
      fmt_00._M_len = 0x21;
      CLogger::Warn<char_const*&>((CLogger *)&RS.field_0x140,fmt_00,&format_local);
      return;
    }
    pRVar12 = *(ROOM_INDEX_DATA **)((long)arg2 + 0xa8);
    if (pRVar12 == (ROOM_INDEX_DATA *)0x0) {
      return;
    }
  }
  ppCVar13 = &pRVar12->people;
  uVar7 = type & 0xfffffffe;
  local_24b0 = (CLogger *)&RS.field_0x140;
  local_24b8 = uVar16;
  do {
    ch_00 = *ppCVar13;
    if (ch_00 == (CHAR_DATA *)0x0) {
      return;
    }
    bVar5 = is_npc(ch_00);
    if ((((bVar5) || (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) && (min_pos <= ch_00->position)) &&
       ((iVar14 = (int)uVar16, iVar14 != 3 || (ch_00 == ch)))) {
      if (iVar14 == 2) {
        bVar5 = ch_00 != (CHAR_DATA *)arg2;
LAB_002d80e2:
        if (!(bool)(bVar5 | ch_00 == ch)) {
LAB_002d80ea:
          pcVar11 = buf;
          pcVar15 = format_local;
LAB_002d80f7:
          for (; cVar9 = *pcVar15, cVar9 == '$'; pcVar15 = pcVar15 + 2) {
            cVar9 = pcVar15[1];
            if ((arg2 == (void *)0x0) && (cVar9 != 'I' && 0xe5 < (byte)(cVar9 + 0xa5U))) {
              sStack_24f0 = 0x1e;
              pcVar10 = "Act: missing arg2 for code {}.";
LAB_002d81c1:
              fmt._M_str = pcVar10;
              fmt._M_len = sStack_24f0;
              CLogger::Warn<char_const&>(local_24b0,fmt,pcVar15 + 1);
              pcVar10 = " <@@@> ";
            }
            else {
              pcVar10 = (char *)arg1;
              switch(cVar9) {
              case 'd':
                pcVar10 = "door";
                if ((arg2 != (void *)0x0) && (pcVar10 = "door", *arg2 != '\0')) {
                  pcVar10 = fname;
                  one_argument((char *)arg2,pcVar10);
                }
                break;
              case 'e':
                uVar1 = ch->sex;
LAB_002d82c2:
                if (1 < (short)uVar1) {
                  uVar1 = 2;
                }
                if ((short)uVar1 < 1) {
                  uVar1 = 0;
                }
                pcVar10 = act_area::he_she[uVar1];
                break;
              case 'f':
                pcVar10 = ch->true_name;
                if (pcVar10 == (char *)0x0) {
                  pcVar10 = ch->name;
                }
                break;
              case 'g':
              case 'h':
              case 'j':
              case 'k':
              case 'l':
              case 'o':
              case 'q':
              case 'r':
switchD_002d814f_caseD_67:
                sStack_24f0 = 0x11;
                pcVar10 = "Act: bad code {}.";
                goto LAB_002d81c1;
              case 'i':
                uVar4 = *arg1;
LAB_002d83c2:
                pcVar10 = buf2;
                sprintf(pcVar10,"%d",(ulong)uVar4);
                break;
              case 'm':
                uVar2 = ch->sex;
LAB_002d836e:
                if (1 < (short)uVar2) {
                  uVar2 = 2;
                }
                if ((short)uVar2 < 1) {
                  uVar2 = 0;
                }
                pcVar10 = act_area::him_her[uVar2];
                break;
              case 'n':
                ch_01 = ch;
LAB_002d83dd:
                pcVar10 = get_descr_form(ch_01,ch_00,false);
                break;
              case 'p':
                pcVar10 = "something";
                if (arg1 != (void *)0x0) {
                  bVar5 = can_see_obj(ch_00,(OBJ_DATA *)arg1);
                  pcVar10 = "something";
                  if (bVar5) {
                    pcVar10 = *(char **)((long)arg1 + 0x88);
                  }
                  uVar16 = (long)(pcVar15 + 1) - (long)format_local;
                  if ((3 < (long)uVar16) &&
                     (((pcVar15[-3] == '\'' && (pcVar15[-2] == 's')) ||
                      ((5 < uVar16 &&
                       ((pcVar15[-3] == 'u' && pcVar15[-4] == 'o' && (pcVar15[-2] == 'r')))))))) {
                    bVar5 = str_prefix("the ",pcVar10);
                    bVar6 = str_prefix("a ",pcVar10 + (ulong)!bVar5 * 4);
                    pcVar10 = pcVar10 + (ulong)!bVar5 * 4 + (ulong)!bVar6 * 2;
                  }
                }
                break;
              case 's':
                uVar3 = ch->sex;
LAB_002d839a:
                if (1 < (short)uVar3) {
                  uVar3 = 2;
                }
                if ((short)uVar3 < 1) {
                  uVar3 = 0;
                }
                pcVar10 = act_area::his_her[uVar3];
                break;
              case 't':
                break;
              default:
                switch(cVar9) {
                case 'E':
                  uVar1 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                  goto LAB_002d82c2;
                case 'F':
                  pcVar10 = *(char **)((long)arg2 + 0xf0);
                  if (pcVar10 == (char *)0x0) {
                    pcVar10 = *(char **)((long)arg2 + 0xe8);
                  }
                  break;
                default:
                  goto switchD_002d814f_caseD_67;
                case 'I':
                  uVar4 = *arg2;
                  goto LAB_002d83c2;
                case 'M':
                  uVar2 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                  goto LAB_002d836e;
                case 'N':
                  ch_01 = (CHAR_DATA *)arg2;
                  goto LAB_002d83dd;
                case 'P':
                  bVar5 = can_see_obj(ch_00,(OBJ_DATA *)arg2);
                  pcVar10 = "something";
                  if (bVar5) {
                    pcVar10 = *(char **)((long)arg2 + 0x88);
                  }
                  break;
                case 'S':
                  uVar3 = (ushort)*(undefined4 *)((long)arg2 + 0x134);
                  goto LAB_002d839a;
                case 'T':
                  pcVar10 = (char *)arg2;
                }
              }
            }
            for (; cVar9 = *pcVar10, *pcVar11 = cVar9, cVar9 != '\0'; pcVar10 = pcVar10 + 1) {
              pcVar11 = pcVar11 + 1;
            }
          }
          if (cVar9 != '\0') {
            pcVar15 = pcVar15 + 1;
            *pcVar11 = cVar9;
            pcVar11 = pcVar11 + 1;
            goto LAB_002d80f7;
          }
          pcVar11[0] = '\n';
          pcVar11[1] = '\r';
          pcVar11[2] = '\0';
          bVar5 = str_prefix("\x1b[0m",buf);
          if (bVar5) {
            bVar5 = str_prefix("\x1b",buf);
            if (bVar5) {
              cVar9 = (char)buf._0_4_;
              cVar8 = cVar9 + -0x20;
              if (0x19 < (byte)(cVar9 + 0x9fU)) {
                cVar8 = cVar9;
              }
              buf[0] = cVar8;
            }
            else {
              cVar9 = buf[7] + -0x20;
              if (0x19 < (byte)(buf[7] + 0x9fU)) {
                cVar9 = buf[7];
              }
              buf[7] = cVar9;
            }
          }
          else {
            cVar9 = (char)buf._4_4_;
            cVar8 = cVar9 + -0x20;
            if (0x19 < (byte)(cVar9 + 0x9fU)) {
              cVar8 = cVar9;
            }
            buf[4] = cVar8;
          }
          uVar16 = local_24b8;
          if (ch_00->desc != (DESCRIPTOR_DATA *)0x0) {
            write_to_buffer(ch_00->desc,buf,((int)pcVar11 + 2) - (int)buf);
          }
        }
      }
      else if ((iVar14 != 0) || (ch_00 != ch)) {
        switch(iVar14) {
        case 1:
          bVar5 = ch_00 == (CHAR_DATA *)arg2;
          goto LAB_002d80e2;
        default:
          if ((uVar7 != 6) || (ch_00 != ch)) goto LAB_002d80ea;
          break;
        case 5:
          bVar5 = is_immortal(ch_00);
          if ((ch_00 != ch) && (bVar5)) {
            bVar5 = can_see(ch_00,ch);
LAB_002d855e:
            if (bVar5 != false) goto LAB_002d80ea;
          }
          break;
        case 6:
          bVar5 = is_same_group(ch_00,ch);
          if (uVar7 != 6 || ch_00 != ch) goto LAB_002d855e;
          break;
        case 7:
          bVar5 = is_same_group(ch_00,ch);
          if ((!bVar5) && (uVar7 != 6 || ch_00 != ch)) goto LAB_002d80ea;
        }
      }
    }
    ppCVar13 = &ch_00->next_in_room;
  } while( true );
}

Assistant:

void act_new(const char *format, CHAR_DATA *ch, const void *arg1, const void *arg2, int type, int min_pos)
{
	static char *const he_she[] = {"it", "he", "she"};
	static char *const him_her[] = {"it", "him", "her"};
	static char *const his_her[] = {"its", "his", "her"};

	char buf[MAX_STRING_LENGTH], buf2[100];
	char fname[MAX_INPUT_LENGTH];
	CHAR_DATA *to;
	CHAR_DATA *vch = (CHAR_DATA *)arg2;
	OBJ_DATA *obj1 = (OBJ_DATA *)arg1;
	OBJ_DATA *obj2 = (OBJ_DATA *)arg2;
	const char *str;
	const char *i;
	char *point;

	/*
	 * Discard null and zero-length messages.
	 */
	if (format == nullptr || format[0] == '\0')
		return;

	/* discard null rooms and chars */
	if (ch == nullptr || ch->in_room == nullptr)
		return;

	/*colorconv(format, format, ch);*/
	to = ch->in_room->people;

	if (type == TO_VICT)
	{
		if (vch == nullptr)
		{
			RS.Logger.Warn("Act: null vch with TO_VICT. -- {}", format);
			return;
		}

		if (vch->in_room == nullptr)
			return;

		to = vch->in_room->people;
	}

	for (; to != nullptr; to = to->next_in_room)
	{
		if ((!is_npc(to) && to->desc == nullptr) || to->position < min_pos)
			continue;

		if ((type == TO_CHAR) && to != ch)
			continue;

		if (type == TO_VICT && (to != vch || to == ch))
			continue;

		if (type == TO_ROOM && to == ch)
			continue;

		if (type == TO_NOTVICT && (to == ch || to == vch))
			continue;

		if (type == TO_IMMINROOM && (!(is_immortal(to)) || (to == ch) || !(can_see(to, ch))))
			continue;

		if (type == TO_GROUP && !is_same_group(to, ch))
			continue;

		if (type == TO_NOTGROUP && is_same_group(to, ch))
			continue;

		if ((type == TO_GROUP || type == TO_NOTGROUP) && to == ch)
			continue;

		point = buf;
		str = format;

		while (*str != '\0')
		{
			if (*str != '$')
			{
				*point++ = *str++;
				continue;
			}

			++str;

			if (arg2 == nullptr && *str >= 'A' && *str <= 'Z' && *str != 'I')
			{
				RS.Logger.Warn("Act: missing arg2 for code {}.", *str);
				i = " <@@@> ";
			}
			else
			{
				switch (*str)
				{
					/* Thx alex for 't' idea */
					case 't':
						i = (char *)arg1;
						break;
					case 'T':
						i = (char *)arg2;
						break;
					case 'n':
						i = get_descr_form(ch, to, false);
						break;
					case 'N':
						i = get_descr_form(vch, to, false);
						break;
					case 'f':
						i = (ch->true_name ? ch->true_name : ch->name);
						break;
					case 'F':
						i = (vch->true_name ? vch->true_name : vch->name);
						break;
					case 'i':
						sprintf(buf2, "%d", *((int *)arg1));
						i = (const char *)&buf2;
						break;
					case 'I':
						sprintf(buf2, "%d", *((int *)arg2));
						i = (const char *)&buf2;
						break;
					case 'e':
						i = he_she[URANGE(0, ch->sex, 2)];
						break;
					case 'E':
						i = he_she[URANGE(0, vch->sex, 2)];
						break;
					case 'm':
						i = him_her[URANGE(0, ch->sex, 2)];
						break;
					case 'M':
						i = him_her[URANGE(0, vch->sex, 2)];
						break;
					case 's':
						i = his_her[URANGE(0, ch->sex, 2)];
						break;
					case 'S':
						i = his_her[URANGE(0, vch->sex, 2)];
						break;
					case 'p':
						if (obj1 == nullptr)
						{
							i = "something";
							break;
						}

						i = can_see_obj(to, obj1) ? obj1->short_descr : "something";

						// obj article truncation: back up 2-don't truncate the/a from obj short descr unless it's preceded
						// by Your or 's
						if (((str - format) >= 4 && *(str - 4) == '\'' && *(str - 3) == 's')
							|| ((str - format) >= 6 && *(str - 5) == 'o' && *(str - 4) == 'u' && *(str - 3) == 'r'))
						{
							if (!str_prefix("the ", i))
								i += 4;

							if (!str_prefix("a ", i))
								i += 2;
						}

						break;
					case 'P':
						i = can_see_obj(to, obj2) ? obj2->short_descr : "something";
						break;
					case 'd':
						if (arg2 == nullptr || ((char *)arg2)[0] == '\0')
						{
							i = "door";
						}
						else
						{
							one_argument((char *)arg2, fname);
							i = fname;
						}
						break;
					default:
						RS.Logger.Warn("Act: bad code {}.", *str);
						i = " <@@@> ";
						break;
				}
			}

			++str;

			while ((*point = *i) != '\0')
			{
				++point, ++i;
			}
		}

		*point++ = '\n';
		*point++ = '\r';
		*point = '\0';

		if (!str_prefix("\x01B[0m", buf))
			buf[4] = UPPER(buf[4]);
		else if (!str_prefix("\x01B", buf))
			buf[7] = UPPER(buf[7]);
		else
			buf[0] = UPPER(buf[0]);

		if (to->desc != nullptr)
			write_to_buffer(to->desc, buf, point - buf);
	}
}